

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 local_1e8 [8];
  CMakeParser parser;
  Config config;
  char **argv_local;
  int argc_local;
  
  config.input.field_2._8_8_ = argv;
  ParseOptions((Config *)&parser.evalMode,argc,argv);
  CMakeParser::CMakeParser((CMakeParser *)local_1e8);
  CMakeParser::SetDebugMode((CMakeParser *)local_1e8,parser.evalMode);
  CMakeParser::SetEvaluationMode((CMakeParser *)local_1e8,parser._412_4_);
  CMakeParser::SetInput((CMakeParser *)local_1e8,config.debugMode,(string *)&config.inputMode);
  iVar1 = CMakeParser::Parse((CMakeParser *)local_1e8);
  CMakeParser::~CMakeParser((CMakeParser *)local_1e8);
  Config::~Config((Config *)&parser.evalMode);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    const auto config = ParseOptions(argc, argv);
    CMakeParser parser;

    parser.SetDebugMode(config.debugMode);
    parser.SetEvaluationMode(config.evalMode);
    parser.SetInput(config.inputMode, config.input);

    return parser.Parse();
}